

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicstransform.cpp
# Opt level: O0

void __thiscall QGraphicsScale::setOrigin(QGraphicsScale *this,QVector3D *point)

{
  long lVar1;
  QVector3D v2;
  QVector3D v1;
  bool bVar2;
  QGraphicsScalePrivate *this_00;
  undefined8 *in_RSI;
  undefined8 in_RDI;
  long in_FS_OFFSET;
  QGraphicsScalePrivate *d;
  float fVar3;
  undefined4 in_stack_ffffffffffffffc4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  fVar3 = (float)((ulong)in_RDI >> 0x20);
  this_00 = d_func((QGraphicsScale *)0xa2d97e);
  v1.v[1] = (float)in_stack_ffffffffffffffc4;
  v1.v[0] = (float)*(undefined4 *)(in_RSI + 1);
  v1.v[2] = (float)*(undefined8 *)(this_00->origin).v;
  v2.v._4_8_ = *in_RSI;
  v2.v[0] = fVar3;
  bVar2 = ::operator==(v1,v2);
  if (!bVar2) {
    *(undefined8 *)(this_00->origin).v = *in_RSI;
    (this_00->origin).v[2] = *(float *)(in_RSI + 1);
    QGraphicsTransform::update((QGraphicsTransform *)this_00);
    originChanged((QGraphicsScale *)0xa2da2a);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsScale::setOrigin(const QVector3D &point)
{
    Q_D(QGraphicsScale);
    if (d->origin == point)
        return;
    d->origin = point;
    update();
    emit originChanged();
}